

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O2

BarAndSpaceI ZXing::OneD::RowReader::NarrowWideThreshold(PatternView *view)

{
  ushort uVar1;
  int iVar2;
  BarAndSpaceI *pBVar3;
  BarAndSpaceI BVar4;
  int i;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  ushort uVar13;
  ushort uStack_e;
  BarAndSpaceI M;
  BarAndSpaceI m;
  BarAndSpaceI res;
  BarAndSpaceI BVar5;
  BarAndSpaceI BVar6;
  BarAndSpaceI BVar7;
  
  pBVar3 = (BarAndSpaceI *)view->_data;
  m = *pBVar3;
  M = m;
  iVar2 = view->_size;
  for (lVar9 = 2; lVar9 < iVar2; lVar9 = lVar9 + 1) {
    uVar10 = (ulong)(((uint)lVar9 & 1) * 2);
    uVar11 = (&pBVar3->bar)[lVar9];
    uVar13 = *(ushort *)((long)&m.bar + uVar10);
    if (uVar11 <= uVar13) {
      uVar13 = uVar11;
    }
    uVar1 = *(ushort *)((long)&M.bar + uVar10);
    if (uVar11 < uVar1) {
      uVar11 = uVar1;
    }
    *(ushort *)((long)&m.bar + uVar10) = uVar13;
    *(ushort *)((long)&M.bar + uVar10) = uVar11;
  }
  lVar9 = 1;
  while( true ) {
    if (lVar9 == 3) {
      BVar4.bar = 0;
      BVar4.space = 0;
      return BVar4;
    }
    uVar11 = (&uStack_e)[lVar9];
    uVar13 = (&M.space)[lVar9];
    if ((uint)uVar13 * 4 + 4 < (uint)uVar11) {
      BVar7.bar = 0;
      BVar7.space = 0;
      return BVar7;
    }
    uVar12 = (uint)lVar9 & 1;
    if ((uint)(&M.bar)[uVar12] + (uint)(&M.bar)[uVar12] * 2 < (uint)uVar11) {
      BVar6.bar = 0;
      BVar6.space = 0;
      return BVar6;
    }
    if ((uint)(&m.bar)[uVar12] * 2 + 2 < (uint)uVar13) break;
    uVar8 = (uint)uVar11 + (uint)uVar13 >> 1;
    uVar12 = (uint)(uVar13 >> 1) + (uint)uVar13;
    if (uVar12 < uVar8) {
      uVar12 = uVar8;
    }
    (&m.space)[lVar9] = (unsigned_short)uVar12;
    lVar9 = lVar9 + 1;
  }
  BVar5.bar = 0;
  BVar5.space = 0;
  return BVar5;
}

Assistant:

value_type operator[](int i) const
	{
//		assert(i < _count);
		return _data[i];
	}